

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

errr finish_parse_artifact(parser *p)

{
  byte *pbVar1;
  ushort uVar2;
  void *pvVar3;
  undefined8 *puVar4;
  curse *pcVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  void *pvVar8;
  object *poVar9;
  uint16_t uVar10;
  bitflag *pbVar11;
  ulong uVar12;
  long lVar13;
  
  z_info->a_max = 0;
  pvVar8 = parser_priv(p);
  if (pvVar8 != (void *)0x0) {
    uVar10 = z_info->a_max;
    do {
      uVar10 = uVar10 + 1;
      pvVar8 = *(void **)((long)pvVar8 + 0x18);
    } while (pvVar8 != (void *)0x0);
    z_info->a_max = uVar10;
  }
  a_info = (artifact *)mem_zalloc((ulong)((uint)z_info->a_max * 0x140) + 0x140);
  aup_info = (artifact_upkeep *)mem_zalloc((ulong)z_info->a_max * 8 + 8);
  uVar2 = z_info->a_max;
  uVar12 = (ulong)uVar2;
  pvVar8 = parser_priv(p);
  if (pvVar8 != (void *)0x0) {
    lVar13 = (ulong)(((uint)uVar2 * 4 + (uint)uVar2) * 0x40) + 0x140;
    do {
      if ((long)uVar12 < 1) {
        __assert_fail("aidx > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-init.c"
                      ,0xbff,"errr finish_parse_artifact(struct parser *)");
      }
      memcpy(a_info[-1].flags + lVar13 + -0x48,pvVar8,0x140);
      *(uint32_t *)((long)a_info + lVar13 + -0x130) = (uint32_t)uVar12;
      pvVar3 = *(void **)((long)pvVar8 + 0x18);
      pbVar11 = a_info->flags + lVar13 + -0x48;
      if ((long)(ulong)z_info->a_max <= (long)uVar12) {
        pbVar11 = (bitflag *)0x0;
      }
      *(bitflag **)((long)a_info + lVar13 + -0x128) = pbVar11;
      mem_free(pvVar8);
      aup_info[uVar12].aidx = (uint32_t)uVar12;
      uVar12 = uVar12 - 1;
      lVar13 = lVar13 + -0x140;
      pvVar8 = pvVar3;
    } while (pvVar3 != (void *)0x0);
  }
  z_info->a_max = z_info->a_max + 1;
  wVar6 = tval_find_idx("none");
  wVar7 = lookup_sval(wVar6,"<unknown item>");
  unknown_item_kind = lookup_kind(wVar6,wVar7);
  wVar7 = lookup_sval(wVar6,"<unknown treasure>");
  unknown_gold_kind = lookup_kind(wVar6,wVar7);
  wVar7 = lookup_sval(wVar6,"<pile>");
  pile_kind = lookup_kind(wVar6,wVar7);
  wVar7 = lookup_sval(wVar6,"<curse object>");
  curse_object_kind = lookup_kind(wVar6,wVar7);
  wVar6 = tval_find_idx("none");
  wVar6 = lookup_sval(wVar6,"<curse object>");
  if (1 < z_info->curse_max) {
    uVar12 = 1;
    lVar13 = 0x50;
    do {
      pcVar5 = curses;
      puVar4 = *(undefined8 **)(curses->conflict_flags + lVar13 + -0x28);
      *puVar4 = curse_object_kind;
      *(char *)((long)puVar4 + 0x3d) = (char)wVar6;
      if (puVar4[5] == 0) {
        poVar9 = object_new();
        *(object **)(*(long *)(pcVar5->conflict_flags + lVar13 + -0x28) + 0x28) = poVar9;
      }
      puVar4 = *(undefined8 **)(*(long *)(pcVar5->conflict_flags + lVar13 + -0x28) + 0x28);
      *puVar4 = curse_object_kind;
      *(char *)(*(long *)(*(long *)(curses->conflict_flags + lVar13 + -0x28) + 0x28) + 0x3d) =
           (char)wVar6;
      pbVar1 = (byte *)((long)puVar4 + 0x11b);
      *pbVar1 = *pbVar1 | 2;
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + 0x38;
    } while (uVar12 < z_info->curse_max);
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_artifact(struct parser *p) {
	struct artifact *a, *n;
	int none, aidx;

	/* Scan the list for the max id */
	z_info->a_max = 0;
	a = parser_priv(p);
	while (a) {
		z_info->a_max++;
		a = a->next;
	}

	/* Allocate the direct access list and copy the data to it */
	a_info = mem_zalloc((z_info->a_max + 1) * sizeof(*a));
	aup_info = mem_zalloc((z_info->a_max + 1) * sizeof(*aup_info));
	aidx = z_info->a_max;
	for (a = parser_priv(p); a; a = n, aidx--) {
		assert(aidx > 0);

		memcpy(&a_info[aidx], a, sizeof(*a));
		a_info[aidx].aidx = aidx;
		n = a->next;
		a_info[aidx].next = (aidx < z_info->a_max) ?
			&a_info[aidx + 1] : NULL;
		mem_free(a);

		aup_info[aidx].aidx = aidx;
	}
	z_info->a_max += 1;

	/* Now we're done with object kinds, deal with object-like things */
	none = tval_find_idx("none");
	unknown_item_kind = lookup_kind(none, lookup_sval(none, "<unknown item>"));
	unknown_gold_kind = lookup_kind(none,
									lookup_sval(none, "<unknown treasure>"));
	pile_kind = lookup_kind(none, lookup_sval(none, "<pile>"));
	curse_object_kind = lookup_kind(none, lookup_sval(none, "<curse object>"));
	write_curse_kinds();
	parser_destroy(p);
	return 0;
}